

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_hook_sys_call.cpp
# Opt level: O0

int setsockopt(int __fd,int __level,int __optname,void *__optval,socklen_t __optlen)

{
  bool bVar1;
  rpchook_t *prVar2;
  timeval *val;
  rpchook_t *lp;
  socklen_t option_len_local;
  void *option_value_local;
  int option_name_local;
  int level_local;
  int fd_local;
  
  if (g_sys_setsockopt_func == (setsockopt_pfn_t)0x0) {
    g_sys_setsockopt_func = (setsockopt_pfn_t)dlsym(0xffffffffffffffff,"setsockopt");
  }
  bVar1 = co_is_enable_sys_hook();
  if (bVar1) {
    prVar2 = get_by_fd(__fd);
    if ((prVar2 != (rpchook_t *)0x0) && (__level == 1)) {
      if (__optname == 0x14) {
        (prVar2->read_timeout).tv_sec = *__optval;
        (prVar2->read_timeout).tv_usec = *(__suseconds_t *)((long)__optval + 8);
      }
      else if (__optname == 0x15) {
        (prVar2->write_timeout).tv_sec = *__optval;
        (prVar2->write_timeout).tv_usec = *(__suseconds_t *)((long)__optval + 8);
      }
    }
    level_local = (*g_sys_setsockopt_func)(__fd,__level,__optname,__optval,__optlen);
  }
  else {
    level_local = (*g_sys_setsockopt_func)(__fd,__level,__optname,__optval,__optlen);
  }
  return level_local;
}

Assistant:

int setsockopt(int fd, int level, int option_name,
			                 const void *option_value, socklen_t option_len)
{
	HOOK_SYS_FUNC( setsockopt );

	if( !co_is_enable_sys_hook() )
	{
		return g_sys_setsockopt_func( fd,level,option_name,option_value,option_len );
	}
	rpchook_t *lp = get_by_fd( fd );

	if( lp && SOL_SOCKET == level )
	{
		struct timeval *val = (struct timeval*)option_value;
		if( SO_RCVTIMEO == option_name  ) 
		{
			memcpy( &lp->read_timeout,val,sizeof(*val) );
		}
		else if( SO_SNDTIMEO == option_name )
		{
			memcpy( &lp->write_timeout,val,sizeof(*val) );
		}
	}
	return g_sys_setsockopt_func( fd,level,option_name,option_value,option_len );
}